

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Response * __thiscall
ot::commissioner::coap::Coap::ResponsesCache::Match(ResponsesCache *this,Request *aRequest)

{
  uint16_t uVar1;
  Endpoint *pEVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var3 = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->mContainer)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    pEVar2 = aRequest->mEndpoint;
    uVar1 = (aRequest->mHeader).mMessageId;
    do {
      if (((Endpoint *)p_Var3[5]._M_parent == pEVar2) &&
         (*(uint16_t *)((long)&p_Var3[1]._M_parent + 2) == uVar1)) {
        return (Response *)&p_Var3[1]._M_parent;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return (Response *)0x0;
}

Assistant:

const Response *Coap::ResponsesCache::Match(const Request &aRequest) const
{
    for (const auto &kv : mContainer)
    {
        const auto &response = kv.second;
        if (response.GetEndpoint() != aRequest.GetEndpoint())
        {
            continue;
        }
        if (response.GetMessageId() != aRequest.GetMessageId())
        {
            continue;
        }
        return &response;
    }
    return nullptr;
}